

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

void __thiscall Function::Function(Function *this,FunctionType type)

{
  undefined4 in_register_00000034;
  EVP_PKEY_CTX *ctx;
  FunctionType type_local;
  Function *this_local;
  
  ctx = (EVP_PKEY_CTX *)CONCAT44(in_register_00000034,type);
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Function_0018f008;
  std::vector<Function_*,_std::allocator<Function_*>_>::vector(&this->vParents);
  std::__cxx11::string::string((string *)&this->sName);
  init(this,ctx);
  setType(this,type);
  return;
}

Assistant:

Function::Function( FunctionType type )
{
	init();
	setType(type);
}